

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O0

void __thiscall wallet::InternalPage::Unserialize<AutoFile>(InternalPage *this,AutoFile *s)

{
  long lVar1;
  runtime_error *prVar2;
  AutoFile *in_RSI;
  vector<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_> *in_RDI;
  long in_FS_OFFSET;
  int64_t in_stack_00000028;
  int64_t to_jump;
  uint32_t i;
  int64_t pos;
  InternalRecord record;
  RecordHeader rec_hdr;
  uint16_t index;
  undefined6 in_stack_ffffffffffffff68;
  uint16_t in_stack_ffffffffffffff6e;
  InternalRecord *in_stack_ffffffffffffff70;
  AutoFile *in_stack_ffffffffffffff78;
  InternalRecord *in_stack_ffffffffffffff80;
  uint local_54;
  long local_50;
  int in_stack_ffffffffffffffe4;
  AutoFile *in_stack_ffffffffffffffe8;
  char local_e;
  ushort local_a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = 0x1a;
  local_54 = 0;
  do {
    if (*(ushort *)
         ((long)&(in_RDI->
                 super__Vector_base<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage + 4) <= local_54) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
LAB_017caf20:
      __stack_chk_fail();
    }
    AutoFile::operator>>(in_stack_ffffffffffffff78,(unsigned_short *)in_stack_ffffffffffffff70);
    if (((ulong)in_RDI[1].
                super__Vector_base<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_>.
                _M_impl.super__Vector_impl_data._M_finish & 1) != 0) {
      local_a = internal_bswap_16(in_stack_ffffffffffffff6e);
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_ffffffffffffff78,
               (value_type_conflict4 *)in_stack_ffffffffffffff70);
    local_50 = local_50 + 2;
    if ((long)((ulong)local_a - local_50) < 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Internal record position not in page");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_017caf20;
    }
    AutoFile::ignore(in_RSI,(ulong)local_a - local_50);
    RecordHeader::RecordHeader
              ((RecordHeader *)CONCAT26(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68),false);
    AutoFile::operator>>(in_stack_ffffffffffffff78,&in_stack_ffffffffffffff70->m_header);
    if (local_e != '\x01') {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Unknown record type in internal page");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_017caf20;
    }
    in_stack_ffffffffffffff70 = (InternalRecord *)&stack0xffffffffffffffc8;
    InternalRecord::InternalRecord
              ((InternalRecord *)CONCAT26(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68),
               (RecordHeader *)0x17cae4c);
    AutoFile::operator>>(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::vector<wallet::InternalRecord,std::allocator<wallet::InternalRecord>>::
    emplace_back<wallet::InternalRecord&>(in_RDI,in_stack_ffffffffffffff80);
    AutoFile::seek(in_stack_ffffffffffffffe8,in_stack_00000028,in_stack_ffffffffffffffe4);
    InternalRecord::~InternalRecord
              ((InternalRecord *)CONCAT26(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68));
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void Unserialize(Stream& s)
    {
        // Current position within the page
        int64_t pos = PageHeader::SIZE;

        // Get the items
        for (uint32_t i = 0; i < m_header.entries; ++i) {
            // Get the index
            uint16_t index;
            s >> index;
            if (m_header.other_endian) {
                index = internal_bswap_16(index);
            }
            indexes.push_back(index);
            pos += sizeof(uint16_t);

            // Go to the offset from the index
            int64_t to_jump = index - pos;
            if (to_jump < 0) {
                throw std::runtime_error("Internal record position not in page");
            }
            s.ignore(to_jump);

            // Read the record
            RecordHeader rec_hdr(m_header.other_endian);
            s >> rec_hdr;
            to_jump += RecordHeader::SIZE;

            if (rec_hdr.type != RecordType::KEYDATA) {
                throw std::runtime_error("Unknown record type in internal page");
            }
            InternalRecord record(rec_hdr);
            s >> record;
            records.emplace_back(record);
            to_jump += InternalRecord::FIXED_SIZE + rec_hdr.len;

            // Go back to the indexes
            s.seek(-to_jump, SEEK_CUR);
        }
    }